

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_schnorrsig_sign_custom
              (secp256k1_context *ctx,uchar *sig64,uchar *msg,size_t msglen,
              secp256k1_keypair *keypair,secp256k1_schnorrsig_extraparams *extraparams)

{
  secp256k1_nonce_function_hardened noncefp;
  void *ndata;
  int iVar1;
  
  if (ctx == (secp256k1_context *)0x0) {
    secp256k1_schnorrsig_sign_custom_cold_2();
LAB_00120639:
    secp256k1_schnorrsig_sign_custom_cold_1();
    iVar1 = 0;
  }
  else {
    noncefp = (secp256k1_nonce_function_hardened)0x0;
    if (extraparams == (secp256k1_schnorrsig_extraparams *)0x0) {
      ndata = (void *)0x0;
    }
    else {
      do {
        iVar1 = (uint)(byte)noncefp[(long)extraparams->magic] - (uint)(byte)noncefp[0x188860];
        if (noncefp[(long)extraparams->magic] != noncefp[0x188860]) goto LAB_0012060d;
        noncefp = noncefp + 1;
      } while (noncefp != (secp256k1_nonce_function_hardened)0x4);
      iVar1 = 0;
LAB_0012060d:
      if (iVar1 != 0) goto LAB_00120639;
      noncefp = extraparams->noncefp;
      ndata = extraparams->ndata;
    }
    iVar1 = secp256k1_schnorrsig_sign_internal(ctx,sig64,msg,msglen,keypair,noncefp,ndata);
  }
  return iVar1;
}

Assistant:

int secp256k1_schnorrsig_sign_custom(const secp256k1_context* ctx, unsigned char *sig64, const unsigned char *msg, size_t msglen, const secp256k1_keypair *keypair, secp256k1_schnorrsig_extraparams *extraparams) {
    secp256k1_nonce_function_hardened noncefp = NULL;
    void *ndata = NULL;
    VERIFY_CHECK(ctx != NULL);

    if (extraparams != NULL) {
        ARG_CHECK(secp256k1_memcmp_var(extraparams->magic,
                                       schnorrsig_extraparams_magic,
                                       sizeof(extraparams->magic)) == 0);
        noncefp = extraparams->noncefp;
        ndata = extraparams->ndata;
    }
    return secp256k1_schnorrsig_sign_internal(ctx, sig64, msg, msglen, keypair, noncefp, ndata);
}